

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

uint do_with_oh<unsigned_int>
               (qpdf_data qpdf,qpdf_oh oh,function<unsigned_int_()> *fallback,
               function<unsigned_int_(QPDFObjectHandle_&)> *fn)

{
  uint uVar1;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_60;
  long local_50;
  undefined8 uStack_48;
  qpdf_oh local_40;
  function<unsigned_int_()> local_38;
  
  std::function<unsigned_int_()>::function(&local_38,fallback);
  std::function<unsigned_int_(QPDFObjectHandle_&)>::function
            ((function<unsigned_int_(QPDFObjectHandle_&)> *)&local_60,fn);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_40 = oh;
  local_88._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_88._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x18) = uStack_48;
  if (local_50 != 0) {
    *(void **)local_88._M_unused._0_8_ = local_60._M_unused._M_object;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_60._8_8_;
    *(long *)((long)local_88._M_unused._0_8_ + 0x10) = local_50;
    local_50 = 0;
    uStack_48 = 0;
  }
  *(qpdf_oh *)((long)local_88._M_unused._0_8_ + 0x20) = oh;
  pcStack_70 = std::
               _Function_handler<unsigned_int_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<unsigned_int_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  uVar1 = trap_oh_errors<unsigned_int>
                    (qpdf,&local_38,(function<unsigned_int_(_qpdf_data_*)> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::_Function_base::~_Function_base(&local_38.super__Function_base);
  return uVar1;
}

Assistant:

static RET
do_with_oh(
    qpdf_data qpdf,
    qpdf_oh oh,
    std::function<RET()> fallback,
    std::function<RET(QPDFObjectHandle&)> fn)
{
    return trap_oh_errors<RET>(qpdf, fallback, [fn, oh](qpdf_data q) {
        auto i = q->oh_cache.find(oh);
        bool result = ((i != q->oh_cache.end()) && (i->second).get());
        if (!result) {
            QTC::TC("qpdf", "qpdf-c invalid object handle");
            throw QPDFExc(
                qpdf_e_internal,
                q->qpdf->getFilename(),
                std::string("C API object handle ") + std::to_string(oh),
                0,
                "attempted access to unknown object handle");
        }
        return fn(*(q->oh_cache[oh]));
    });
}